

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O3

void __thiscall
flatbuffers::FlatCompiler::LoadBinarySchema
          (FlatCompiler *this,Parser *parser,string *filename,string *contents)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = Parser::Deserialize(parser,(uint8_t *)(contents->_M_dataplus)._M_p,
                              contents->_M_string_length);
  if (!bVar1) {
    std::operator+(&local_38,"failed to load binary schema: ",filename);
    (*(this->params_).error_fn)(this,&local_38,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void FlatCompiler::LoadBinarySchema(flatbuffers::Parser &parser,
                                    const std::string &filename,
                                    const std::string &contents) {
  if (!parser.Deserialize(reinterpret_cast<const uint8_t *>(contents.c_str()),
                          contents.size())) {
    Error("failed to load binary schema: " + filename, false, false);
  }
}